

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall Logging::saveLog(Logging *this)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  pointer pdVar8;
  long *plVar9;
  ulong *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint __val;
  string __str;
  ofstream outfile;
  ulong *local_2f0;
  uint local_2e8;
  undefined4 uStack_2e4;
  ulong local_2e0 [2];
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250 [2];
  long local_240 [2];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  lVar4 = std::chrono::_V2::system_clock::now();
  currentDateTime_abi_cxx11_();
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x10da6d);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_280 = *plVar9;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar9;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  __val = (int)(SUB168(SEXT816(lVar4) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
          (SUB164(SEXT816(lVar4) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_2a0 = *puVar10;
    lStack_298 = plVar5[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar10;
    local_2b0 = (ulong *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar3 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar11 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0010b967;
      }
      if (uVar11 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0010b967;
      }
      if (uVar11 < 10000) goto LAB_0010b967;
      bVar1 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0010b967:
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2f0,local_2e8,__val);
  uVar12 = CONCAT44(uStack_2e4,local_2e8) + local_2a8;
  uVar13 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar13 = local_2a0;
  }
  if (uVar13 < uVar12) {
    uVar13 = 0xf;
    if (local_2f0 != local_2e0) {
      uVar13 = local_2e0[0];
    }
    if (uVar13 < uVar12) goto LAB_0010b9cc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_2b0);
  }
  else {
LAB_0010b9cc:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2f0);
  }
  local_2d0 = &local_2c0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_2c0 = *plVar5;
    uStack_2b8 = puVar6[3];
  }
  else {
    local_2c0 = *plVar5;
    local_2d0 = (long *)*puVar6;
  }
  local_2c8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_260 = *plVar9;
    lStack_258 = plVar5[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar9;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::open((string *)&local_230,(int)&local_268 + ~(_S_bin|_S_ate|_S_app));
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"time,populationID,neuronID,valueType,value",0x2a);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  pdVar8 = (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    uVar12 = 0;
    do {
      poVar7 = std::ostream::_M_insert<double>(pdVar8[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(this->value_neuronID).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&local_230,
                          (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = std::ostream::_M_insert<double>
                         ((this->value_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar12]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
      pdVar8 = (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->value_time).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar8 >> 3));
  }
  std::ofstream::close();
  currentDateTime_abi_cxx11_();
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x10dac6);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_280 = *plVar9;
    lStack_278 = plVar5[3];
    local_290 = &local_280;
  }
  else {
    local_280 = *plVar9;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_2a0 = *puVar10;
    lStack_298 = plVar5[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar10;
    local_2b0 = (ulong *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar3 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar11 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0010bdc3;
      }
      if (uVar11 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0010bdc3;
      }
      if (uVar11 < 10000) goto LAB_0010bdc3;
      bVar1 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_0010bdc3:
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2f0,local_2e8,__val);
  uVar12 = CONCAT44(uStack_2e4,local_2e8) + local_2a8;
  uVar13 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar13 = local_2a0;
  }
  if (uVar13 < uVar12) {
    uVar13 = 0xf;
    if (local_2f0 != local_2e0) {
      uVar13 = local_2e0[0];
    }
    if (uVar12 <= uVar13) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_2b0);
      goto LAB_0010be46;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2f0);
LAB_0010be46:
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_2c0 = *plVar5;
    uStack_2b8 = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *plVar5;
    local_2d0 = (long *)*puVar6;
  }
  local_2c8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_260 = *plVar9;
    lStack_258 = plVar5[3];
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar9;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_270);
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"time,populationID,neuronID,eventType",0x24);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  pdVar8 = (this->event_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->event_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    uVar12 = 0;
    do {
      poVar7 = std::ostream::_M_insert<double>(pdVar8[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(this->event_neuronID).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
      plVar5 = (long *)std::ostream::operator<<
                                 ((ostream *)&local_230,
                                  (this->event_eventType).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar12]);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      uVar12 = uVar12 + 1;
      pdVar8 = (this->event_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(this->event_time).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar8 >> 3));
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Logging::saveLog() {
    ofstream outfile;
    unsigned int timeSinceEpoch = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
    outfile.open("/home/haukur/MasterProject/Logs/value_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,valueType,value" << endl;
    for(int i = 0; i < value_time.size(); i++) {
        outfile << value_time[i] << "," << value_populationID[i] << "," << value_neuronID[i] << ",";
        outfile << value_valueType[i] << "," << value_value[i] << endl;
    }
    outfile.close();
    outfile.open("/home/haukur/MasterProject/Logs/event_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,eventType" << endl;
    for(int i = 0; i < event_time.size(); i++) {
        outfile << event_time[i] << "," << event_populationID[i] << "," << event_neuronID[i] << ",";
        outfile << event_eventType[i] << endl;
    }
    outfile.close();
}